

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int set_wall(level *lev,int x,int y,int horiz)

{
  undefined4 local_28;
  undefined4 local_24;
  int is_2;
  int is_1;
  int wmode;
  int horiz_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  if (horiz == 0) {
    local_24 = check_pos(lev,x + -1,y,1);
    local_28 = check_pos(lev,x + 1,y,2);
  }
  else {
    local_24 = check_pos(lev,x,y + -1,1);
    local_28 = check_pos(lev,x,y + 1,2);
  }
  if (((local_24 == 0) || (local_28 == 0)) && ((local_28 == 0 || (local_24 == 0)))) {
    is_2 = local_24 + local_28;
  }
  else {
    is_2 = 0;
  }
  return is_2;
}

Assistant:

static int set_wall(struct level *lev, int x, int y, int horiz)
{
    int wmode, is_1, is_2;

    if (horiz) {
	is_1 = check_pos(lev, x,y-1, WM_W_TOP);
	is_2 = check_pos(lev, x,y+1, WM_W_BOTTOM);
    } else {
	is_1 = check_pos(lev, x-1,y, WM_W_LEFT);
	is_2 = check_pos(lev, x+1,y, WM_W_RIGHT);
    }
    if (more_than_one(is_1, is_2, 0)) {
	wmode = 0;
    } else {
	wmode = is_1 + is_2;
    }
    return wmode;
}